

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.h
# Opt level: O1

void __thiscall
pstack::Dwarf::DIE::DIE
          (DIE *this,shared_ptr<pstack::Dwarf::Unit> *unit,size_t offset_,
          shared_ptr<pstack::Dwarf::DIE::Raw> *raw)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  this->offset = offset_;
  (this->raw).super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (raw->super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (raw->super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->raw).super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->unit).super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (unit->super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (unit->super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->unit).super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

DIE(const std::shared_ptr<Unit> &unit, size_t offset_, const std::shared_ptr<Raw> &raw)
        : offset(offset_)
        , raw(raw)
        , unit(unit)
        {}